

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_coroutine_wrap(lua_State *L)

{
  ulong uVar1;
  lua_State *in_RDI;
  GCfunc *fn;
  lua_State *plVar2;
  
  lj_cf_coroutine_create(in_RDI);
  plVar2 = in_RDI;
  lua_pushcclosure(L,(lua_CFunction)in_RDI,0);
  uVar1 = (ulong)plVar2->top[-1].u32.lo;
  *(undefined1 *)(uVar1 + 6) = 0x24;
  *(uint32_t *)(uVar1 + 0x10) = (plVar2->glref).ptr32 + 0xec;
  setpc_wrap_aux(in_RDI,(GCfunc *)(ulong)in_RDI->top[-1].u32.lo);
  return 1;
}

Assistant:

LJLIB_CF(coroutine_wrap)
{
  lj_cf_coroutine_create(L);
  lj_lib_pushcc(L, lj_ffh_coroutine_wrap_aux, FF_coroutine_wrap_aux, 1);
  setpc_wrap_aux(L, funcV(L->top-1));
  return 1;
}